

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O3

void anon_unknown.dwarf_7972ae::lh_char_call_doall_arg(void *value,void *arg)

{
  LHASH_DOALL_char *cb;
  
  (**arg)(value,*(undefined8 *)((long)arg + 8));
  return;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}